

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e61bd::Aggregate::finish_cb(Aggregate *this,Caliper *c,Channel *chn)

{
  ostream *poVar1;
  Log local_228;
  Channel *local_20;
  Channel *chn_local;
  Caliper *c_local;
  Aggregate *this_local;
  
  if (this->m_num_dropped_snapshots != 0) {
    local_20 = chn;
    chn_local = (Channel *)c;
    c_local = (Caliper *)this;
    cali::Log::Log(&local_228,1);
    poVar1 = cali::Log::stream(&local_228);
    poVar1 = std::operator<<(poVar1,(string *)this);
    poVar1 = std::operator<<(poVar1,": Aggregate: dropped ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_num_dropped_snapshots);
    poVar1 = std::operator<<(poVar1," snapshots.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    cali::Log::~Log(&local_228);
  }
  return;
}

Assistant:

void finish_cb(Caliper* c, Channel* chn)
    {
        if (m_num_dropped_snapshots > 0)
            Log(1).stream() << m_channel_name << ": Aggregate: dropped " << m_num_dropped_snapshots << " snapshots."
                            << std::endl;
    }